

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

bool glslang::OutputSpvHex
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,char *baseName,
               char *varName)

{
  long lVar1;
  char cVar2;
  void *this;
  ostream *poVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  ofstream out;
  undefined1 auStack_258 [8];
  uint local_250;
  int local_24c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_248;
  char *local_240;
  long local_238;
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  uint auStack_218 [50];
  char acStack_150 [24];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ofstream *)&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)baseName);
  uVar6 = *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18) + 8);
  if ((uVar6 & 5) == 0) {
    local_250 = uVar6;
    local_248 = spirv;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t// ",4);
    this = (void *)std::ostream::operator<<((ostream *)&local_230,0xb);
    poVar3 = (ostream *)std::ostream::operator<<(this,0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"",0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    cVar2 = (char)(ostream *)&local_230;
    if (varName != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\t #pragma once",0xe);
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"const uint32_t ",0xf);
      sVar4 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,varName,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"[] = {",6);
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    local_240 = varName;
    if (0 < (int)((ulong)((long)(local_248->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_248->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2)) {
      iVar5 = 1;
      lVar8 = 0;
      pvVar9 = local_248;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
        lVar7 = 8;
        local_24c = iVar5;
        local_238 = lVar8;
        do {
          if ((int)((ulong)((long)(pvVar9->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar9->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) <= lVar8) break;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"0x",2);
          *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
               *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 8;
          *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
          lVar1 = *(long *)(local_230 + -0x18);
          if (acStack_150[lVar1 + 1] == '\0') {
            std::ios::widen((char)auStack_258 + (char)lVar1 + '(');
            acStack_150[lVar1 + 1] = '\x01';
          }
          acStack_150[lVar1] = '0';
          std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          pvVar9 = local_248;
          if (iVar5 < (int)((ulong)((long)(local_248->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_248->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 2)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
          }
          iVar5 = iVar5 + 1;
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        lVar8 = local_238 + 8;
        iVar5 = local_24c + 8;
      } while ((int)lVar8 <
               (int)((ulong)((long)(pvVar9->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar9->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
    }
    if (local_240 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"};",2);
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    std::ofstream::close();
    uVar6 = local_250;
  }
  else {
    printf("ERROR: Failed to open file: %s\n",baseName);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_insert<long>;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (uVar6 & 5) == 0;
}

Assistant:

bool OutputSpvHex(const std::vector<unsigned int>& spirv, const char* baseName, const char* varName)
{
    std::ofstream out;
    out.open(baseName, std::ios::binary | std::ios::out);
    if (out.fail()) {
        printf("ERROR: Failed to open file: %s\n", baseName);
        return false;
    }
    out << "\t// " <<
        GetSpirvGeneratorVersion() <<
        GLSLANG_VERSION_MAJOR << "." << GLSLANG_VERSION_MINOR << "." << GLSLANG_VERSION_PATCH <<
        GLSLANG_VERSION_FLAVOR << std::endl;
    if (varName != nullptr) {
        out << "\t #pragma once" << std::endl;
        out << "const uint32_t " << varName << "[] = {" << std::endl;
    }
    const int WORDS_PER_LINE = 8;
    for (int i = 0; i < (int)spirv.size(); i += WORDS_PER_LINE) {
        out << "\t";
        for (int j = 0; j < WORDS_PER_LINE && i + j < (int)spirv.size(); ++j) {
            const unsigned int word = spirv[i + j];
            out << "0x" << std::hex << std::setw(8) << std::setfill('0') << word;
            if (i + j + 1 < (int)spirv.size()) {
                out << ",";
            }
        }
        out << std::endl;
    }
    if (varName != nullptr) {
        out << "};";
        out << std::endl;
    }
    out.close();
    return true;
}